

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_FontFaceQuartet * __thiscall
ON_FontList::QuartetFromQuartetName
          (ON_FontFaceQuartet *__return_storage_ptr__,ON_FontList *this,wchar_t *quartet_name)

{
  bool bVar1;
  int iVar2;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  wchar_t *quartet_name_00;
  ON_FontFaceQuartet *pOVar3;
  bool local_e9;
  ON_FontFaceQuartet local_b0;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString locName;
  int local_70;
  bool failedOnFirstTry;
  int i;
  int quartet_list_count;
  ON_ClassArray<ON_FontFaceQuartet> *quartet_list;
  undefined1 local_50 [16];
  ON_FontFaceQuartet qname;
  wchar_t *quartet_name_local;
  ON_FontList *this_local;
  
  qname.m_bold_italic = (ON_Font *)quartet_name;
  ON_FontFaceQuartet::ON_FontFaceQuartet
            ((ON_FontFaceQuartet *)(local_50 + 8),quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,
             (ON_Font *)0x0,(ON_Font *)0x0);
  ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_50);
  bVar1 = ON_wString::IsEmpty((ON_wString *)local_50);
  ON_wString::~ON_wString((ON_wString *)local_50);
  if (bVar1) {
    quartet_list._0_4_ = 2;
  }
  else {
    this_00 = QuartetList(this);
    iVar2 = ON_ClassArray<ON_FontFaceQuartet>::Count(this_00);
    local_70 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                         (this_00,(ON_FontFaceQuartet *)(local_50 + 8),
                          ON_FontFaceQuartet::CompareQuartetName);
    local_e9 = local_70 < 0 || iVar2 <= local_70;
    locName.m_s._7_1_ = local_e9;
    if (local_70 < 0 || iVar2 <= local_70) {
      ON_wString::ON_wString(&local_88,(wchar_t *)qname.m_bold_italic);
      ON_FontList__EnNameToLocName(&local_80);
      ON_wString::~ON_wString(&local_88);
      bVar1 = ON_wString::IsEmpty(&local_80);
      if (bVar1) {
        quartet_list._0_4_ = 2;
      }
      else {
        quartet_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_80);
        ON_FontFaceQuartet::ON_FontFaceQuartet
                  (&local_b0,quartet_name_00,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,
                   (ON_Font *)0x0);
        ON_FontFaceQuartet::operator=((ON_FontFaceQuartet *)(local_50 + 8),&local_b0);
        ON_FontFaceQuartet::~ON_FontFaceQuartet(&local_b0);
        local_70 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                             (this_00,(ON_FontFaceQuartet *)(local_50 + 8),
                              ON_FontFaceQuartet::CompareQuartetName);
        if ((local_70 < 0) || (iVar2 <= local_70)) {
          quartet_list._0_4_ = 2;
        }
        else {
          quartet_list._0_4_ = 0;
        }
      }
      ON_wString::~ON_wString(&local_80);
      if ((int)quartet_list != 0) goto LAB_00625bd0;
    }
    while( true ) {
      bVar1 = false;
      if (0 < local_70) {
        pOVar3 = ON_ClassArray<ON_FontFaceQuartet>::operator[](this_00,local_70 + -1);
        iVar2 = ON_FontFaceQuartet::CompareQuartetName((ON_FontFaceQuartet *)(local_50 + 8),pOVar3);
        bVar1 = iVar2 == 0;
      }
      if (!bVar1) break;
      local_70 = local_70 + -1;
    }
    pOVar3 = ON_ClassArray<ON_FontFaceQuartet>::operator[](this_00,local_70);
    ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,pOVar3);
    quartet_list._0_4_ = 1;
  }
LAB_00625bd0:
  ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)(local_50 + 8));
  if ((int)quartet_list != 1) {
    ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,&ON_FontFaceQuartet::Empty);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_FontList::QuartetFromQuartetName(
  const wchar_t* quartet_name
) const
{
  for (;;)
  {
    ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
    if (qname.QuartetName().IsEmpty())
      break;

    const ON_ClassArray<ON_FontFaceQuartet>& quartet_list = ON_FontList::QuartetList();
    const int quartet_list_count = quartet_list.Count();
    int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);

    bool failedOnFirstTry = i < 0 || i >= quartet_list_count;
    if (failedOnFirstTry)
    {
      //  ... then find the localized name and try again.
      // The QuartetNames in the QuartetList above are localized but sometimes the quartet_name passed to
      // this function is in english. In many cases the localized name and the english name are the same
      // so there is no problem. It is a problem for Japanese and Chinese languages for example. RH-64285
      ON_wString locName = ON_FontList__EnNameToLocName(quartet_name);
      if (locName.IsEmpty())
      {
        break;
      }
      qname = ON_FontFaceQuartet(locName, nullptr, nullptr, nullptr, nullptr);
      i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
      if (i < 0 || i >= quartet_list_count)
      {
        break;
      }
    }

    while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
      i--;
    return quartet_list[i];
  }
  return ON_FontFaceQuartet::Empty;
}